

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_object_start(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  char *pcVar1;
  
  if ((buf == end) || (*buf != '{')) {
    *more = 0;
    pcVar1 = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    return pcVar1;
  }
  pcVar1 = flatcc_json_parser_space(ctx,buf + 1,end);
  if ((pcVar1 != end) && (*pcVar1 == '}')) {
    *more = 0;
    pcVar1 = flatcc_json_parser_space(ctx,pcVar1 + 1,end);
    return pcVar1;
  }
  *more = 1;
  return pcVar1;
}

Assistant:

static inline const char *flatcc_json_parser_object_start(flatcc_json_parser_t *ctx, const char *buf, const char *end, int *more)
{
    if (buf == end || *buf != '{') {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_expected_object);
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf != end && *buf == '}') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
    *more = 1;
    return buf;
}